

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

void ImPlot::ShowAltLegend
               (char *title_id,ImPlotOrientation orientation,ImVec2 size,bool interactable)

{
  ImGuiWindow *pIVar1;
  ImDrawList *this;
  ImGuiContext *pIVar2;
  ImPlotContext *pIVar3;
  undefined1 p_min [8];
  ImVec2 p_max;
  bool bVar4;
  ImU32 IVar5;
  ImU32 col;
  ImPlotPlot *plot_00;
  ImGuiIO *pIVar6;
  bool local_e9;
  ImU32 col_bd;
  ImU32 col_bg;
  undefined1 local_d0 [8];
  ImRect legend_bb;
  ImVec2 legend_pos;
  ImVec2 local_98;
  undefined1 local_90 [8];
  ImRect bb_frame;
  ImVec2 local_78;
  ImVec2 frame_size;
  ImVec2 local_58;
  ImVec2 default_size;
  ImVec2 legend_size;
  ImPlotPlot *plot;
  ImDrawList *DrawList;
  ImGuiWindow *Window;
  ImGuiContext *G;
  ImPlotContext *gp;
  bool interactable_local;
  ImPlotOrientation orientation_local;
  char *title_id_local;
  ImVec2 size_local;
  
  pIVar3 = GImPlot;
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if ((pIVar1->SkipItems & 1U) == 0) {
    this = pIVar1->DrawList;
    plot_00 = GetPlot(title_id);
    ImVec2::ImVec2(&default_size);
    local_58 = ::operator*(&(pIVar3->Style).LegendPadding,2.0);
    if (plot_00 != (ImPlotPlot *)0x0) {
      default_size = CalcLegendSize(plot_00,&(pIVar3->Style).LegendInnerPadding,
                                    &(pIVar3->Style).LegendSpacing,orientation);
      frame_size = ::operator*(&(pIVar3->Style).LegendPadding,2.0);
      local_58 = ::operator+(&default_size,&frame_size);
    }
    bb_frame.Max = size;
    local_78 = ImGui::CalcItemSize(size,local_58.x,local_58.y);
    local_98 = ::operator+(&(pIVar1->DC).CursorPos,&local_78);
    ImRect::ImRect((ImRect *)local_90,&(pIVar1->DC).CursorPos,&local_98);
    ImGui::ItemSize((ImRect *)local_90,-1.0);
    bVar4 = ImGui::ItemAdd((ImRect *)local_90,0,(ImRect *)local_90,0);
    p_max = bb_frame.Min;
    p_min = local_90;
    if (bVar4) {
      IVar5 = GetStyleColorU32(5);
      ImGui::RenderFrame((ImVec2)p_min,p_max,IVar5,true,(pIVar2->Style).FrameRounding);
      ImDrawList::PushClipRect(this,(ImVec2)local_90,bb_frame.Min,true);
      if (plot_00 != (ImPlotPlot *)0x0) {
        legend_bb.Max =
             GetLocationPos((ImRect *)local_90,&default_size,0,&(pIVar3->Style).LegendPadding);
        _col_bd = ::operator+(&legend_bb.Max,&default_size);
        ImRect::ImRect((ImRect *)local_d0,&legend_bb.Max,(ImVec2 *)&col_bd);
        local_e9 = false;
        if (interactable) {
          pIVar6 = ImGui::GetIO();
          local_e9 = ImRect::Contains((ImRect *)local_90,&pIVar6->MousePos);
        }
        IVar5 = GetStyleColorU32(8);
        col = GetStyleColorU32(9);
        ImDrawList::AddRectFilled(this,(ImVec2 *)local_d0,&legend_bb.Min,IVar5,0.0,0);
        ImDrawList::AddRect(this,(ImVec2 *)local_d0,&legend_bb.Min,col,0.0,0,1.0);
        ShowLegendEntries(plot_00,(ImRect *)local_d0,local_e9,&(pIVar3->Style).LegendInnerPadding,
                          &(pIVar3->Style).LegendSpacing,orientation,this);
      }
      ImDrawList::PopClipRect(this);
    }
  }
  return;
}

Assistant:

void ShowAltLegend(const char* title_id, ImPlotOrientation orientation, const ImVec2 size, bool interactable) {
    ImPlotContext& gp    = *GImPlot;
    ImGuiContext &G      = *GImGui;
    ImGuiWindow * Window = G.CurrentWindow;
    if (Window->SkipItems)
        return;
    ImDrawList &DrawList = *Window->DrawList;
    ImPlotPlot* plot = GetPlot(title_id);
    ImVec2 legend_size;
    ImVec2 default_size = gp.Style.LegendPadding * 2;
    if (plot != NULL) {
        legend_size  = CalcLegendSize(*plot, gp.Style.LegendInnerPadding, gp.Style.LegendSpacing, orientation);
        default_size = legend_size + gp.Style.LegendPadding * 2;
    }
    ImVec2 frame_size = ImGui::CalcItemSize(size, default_size.x, default_size.y);
    ImRect bb_frame = ImRect(Window->DC.CursorPos, Window->DC.CursorPos + frame_size);
    ImGui::ItemSize(bb_frame);
    if (!ImGui::ItemAdd(bb_frame, 0, &bb_frame))
        return;
    ImGui::RenderFrame(bb_frame.Min, bb_frame.Max, GetStyleColorU32(ImPlotCol_FrameBg), true, G.Style.FrameRounding);
    DrawList.PushClipRect(bb_frame.Min, bb_frame.Max, true);
    if (plot != NULL) {
        const ImVec2 legend_pos  = GetLocationPos(bb_frame, legend_size, 0, gp.Style.LegendPadding);
        const ImRect legend_bb(legend_pos, legend_pos + legend_size);
        interactable = interactable && bb_frame.Contains(ImGui::GetIO().MousePos);
        // render legend box
        ImU32  col_bg      = GetStyleColorU32(ImPlotCol_LegendBg);
        ImU32  col_bd      = GetStyleColorU32(ImPlotCol_LegendBorder);
        DrawList.AddRectFilled(legend_bb.Min, legend_bb.Max, col_bg);
        DrawList.AddRect(legend_bb.Min, legend_bb.Max, col_bd);
        // render entries
        ShowLegendEntries(*plot, legend_bb, interactable, gp.Style.LegendInnerPadding, gp.Style.LegendSpacing, orientation, DrawList);
    }
    DrawList.PopClipRect();
}